

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O1

idx_t duckdb::BinaryExecutor::
      SelectFlatLoop<duckdb::hugeint_t,duckdb::hugeint_t,duckdb::NotEquals,false,false,true,true>
                (hugeint_t *ldata,hugeint_t *rdata,SelectionVector *sel,idx_t count,
                ValidityMask *validity_mask,SelectionVector *true_sel,SelectionVector *false_sel)

{
  unsigned_long *puVar1;
  sel_t *psVar2;
  sel_t *psVar3;
  sel_t *psVar4;
  bool bVar5;
  idx_t iVar6;
  bool bVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  unsigned_long uVar13;
  sel_t sVar14;
  ulong uVar15;
  
  if (count + 0x3f < 0x40) {
    iVar6 = 0;
  }
  else {
    puVar1 = (validity_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
    iVar6 = 0;
    lVar9 = 0;
    uVar8 = 0;
    uVar12 = 0;
    do {
      if (puVar1 == (unsigned_long *)0x0) {
        uVar13 = 0xffffffffffffffff;
      }
      else {
        uVar13 = puVar1[uVar8];
      }
      uVar11 = uVar12 + 0x40;
      if (count <= uVar12 + 0x40) {
        uVar11 = count;
      }
      uVar10 = uVar12;
      if (uVar13 == 0xffffffffffffffff) {
        if (uVar12 < uVar11) {
          psVar2 = sel->sel_vector;
          psVar3 = true_sel->sel_vector;
          psVar4 = false_sel->sel_vector;
          uVar15 = uVar12 << 4 | 8;
          do {
            uVar10 = uVar12;
            if (psVar2 != (sel_t *)0x0) {
              uVar10 = (ulong)psVar2[uVar12];
            }
            bVar7 = *(long *)((long)&ldata->lower + uVar15) ==
                    *(long *)((long)&rdata->lower + uVar15);
            bVar5 = *(long *)((long)ldata + (uVar15 - 8)) == *(long *)((long)rdata + (uVar15 - 8));
            psVar3[iVar6] = (sel_t)uVar10;
            iVar6 = iVar6 + (!bVar7 || !bVar5);
            psVar4[lVar9] = (sel_t)uVar10;
            lVar9 = lVar9 + (ulong)(bVar7 && bVar5);
            uVar12 = uVar12 + 1;
            uVar15 = uVar15 + 0x10;
            uVar10 = uVar12;
          } while (uVar11 != uVar12);
        }
      }
      else if (uVar13 == 0) {
        uVar10 = uVar11;
        if (uVar12 < uVar11) {
          psVar2 = sel->sel_vector;
          psVar3 = false_sel->sel_vector;
          do {
            sVar14 = (sel_t)uVar12;
            if (psVar2 != (sel_t *)0x0) {
              sVar14 = psVar2[uVar12];
            }
            psVar3[lVar9] = sVar14;
            lVar9 = lVar9 + 1;
            uVar12 = uVar12 + 1;
          } while (uVar11 != uVar12);
        }
      }
      else if (uVar12 < uVar11) {
        psVar2 = sel->sel_vector;
        psVar3 = true_sel->sel_vector;
        psVar4 = false_sel->sel_vector;
        uVar15 = uVar12 << 4 | 8;
        uVar10 = 0;
        do {
          if (psVar2 == (sel_t *)0x0) {
            sVar14 = (int)uVar12 + (int)uVar10;
          }
          else {
            sVar14 = psVar2[uVar12 + uVar10];
          }
          if ((uVar13 >> (uVar10 & 0x3f) & 1) == 0) {
            bVar7 = false;
          }
          else {
            bVar7 = *(long *)((long)&ldata->lower + uVar15) !=
                    *(long *)((long)&rdata->lower + uVar15) ||
                    *(long *)((long)ldata + (uVar15 - 8)) != *(long *)((long)rdata + (uVar15 - 8));
          }
          psVar3[iVar6] = sVar14;
          iVar6 = iVar6 + bVar7;
          psVar4[lVar9] = sVar14;
          lVar9 = lVar9 + (ulong)(bVar7 ^ 1);
          uVar10 = uVar10 + 1;
          uVar15 = uVar15 + 0x10;
        } while ((uVar12 - uVar11) + uVar10 != 0);
        uVar10 = uVar12 + uVar10;
      }
      uVar8 = uVar8 + 1;
      uVar12 = uVar10;
    } while (uVar8 != count + 0x3f >> 6);
  }
  return iVar6;
}

Assistant:

static inline idx_t SelectFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                                   const SelectionVector *sel, idx_t count, ValidityMask &validity_mask,
	                                   SelectionVector *true_sel, SelectionVector *false_sel) {
		idx_t true_count = 0, false_count = 0;
		idx_t base_idx = 0;
		auto entry_count = ValidityMask::EntryCount(count);
		for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
			auto validity_entry = validity_mask.GetValidityEntry(entry_idx);
			idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
			if (ValidityMask::AllValid(validity_entry)) {
				// all valid: perform operation
				for (; base_idx < next; base_idx++) {
					idx_t result_idx = sel->get_index(base_idx);
					idx_t lidx = LEFT_CONSTANT ? 0 : base_idx;
					idx_t ridx = RIGHT_CONSTANT ? 0 : base_idx;
					bool comparison_result = OP::Operation(ldata[lidx], rdata[ridx]);
					if (HAS_TRUE_SEL) {
						true_sel->set_index(true_count, result_idx);
						true_count += comparison_result;
					}
					if (HAS_FALSE_SEL) {
						false_sel->set_index(false_count, result_idx);
						false_count += !comparison_result;
					}
				}
			} else if (ValidityMask::NoneValid(validity_entry)) {
				// nothing valid: skip all
				if (HAS_FALSE_SEL) {
					for (; base_idx < next; base_idx++) {
						idx_t result_idx = sel->get_index(base_idx);
						false_sel->set_index(false_count, result_idx);
						false_count++;
					}
				}
				base_idx = next;
				continue;
			} else {
				// partially valid: need to check individual elements for validity
				idx_t start = base_idx;
				for (; base_idx < next; base_idx++) {
					idx_t result_idx = sel->get_index(base_idx);
					idx_t lidx = LEFT_CONSTANT ? 0 : base_idx;
					idx_t ridx = RIGHT_CONSTANT ? 0 : base_idx;
					bool comparison_result = ValidityMask::RowIsValid(validity_entry, base_idx - start) &&
					                         OP::Operation(ldata[lidx], rdata[ridx]);
					if (HAS_TRUE_SEL) {
						true_sel->set_index(true_count, result_idx);
						true_count += comparison_result;
					}
					if (HAS_FALSE_SEL) {
						false_sel->set_index(false_count, result_idx);
						false_count += !comparison_result;
					}
				}
			}
		}
		if (HAS_TRUE_SEL) {
			return true_count;
		} else {
			return count - false_count;
		}
	}